

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O1

SQRESULT sq_setconsttable(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  undefined4 uVar2;
  SQObjectType SVar3;
  undefined8 uVar4;
  SQSharedState *pSVar5;
  SQTable *pSVar6;
  SQObjectPtr *pSVar7;
  SQRESULT SVar8;
  
  SVar8 = -1;
  pSVar7 = SQVM::GetUp(v,-1);
  uVar4 = *(undefined8 *)&(pSVar7->super_SQObject)._flags;
  uVar2 = *(undefined4 *)((long)&(pSVar7->super_SQObject)._unVal + 4);
  if ((pSVar7->super_SQObject)._type == OT_TABLE) {
    pSVar5 = v->_sharedstate;
    pSVar6 = (pSVar5->_consts).super_SQObject._unVal.pTable;
    SVar3 = (pSVar5->_consts).super_SQObject._type;
    (pSVar5->_consts).super_SQObject._type = OT_TABLE;
    *(undefined8 *)&(pSVar5->_consts).super_SQObject._flags = uVar4;
    *(undefined4 *)((long)&(pSVar5->_consts).super_SQObject._unVal + 4) = uVar2;
    pSVar1 = &(((pSVar5->_consts).super_SQObject._unVal.pTable)->super_SQDelegable).
              super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    SQVM::Pop(v);
    SVar8 = 0;
  }
  else {
    sq_throwerror(v,"invalid type, expected table");
  }
  return SVar8;
}

Assistant:

SQRESULT sq_setconsttable(HSQUIRRELVM v)
{
    SQObject o = stack_get(v, -1);
    if(sq_istable(o)) {
        _ss(v)->_consts = o;
        v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("invalid type, expected table"));
}